

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::log<char[15],int>(ConsoleLogger *this,char (*args) [15],int *args_1)

{
  int *args_local_1;
  char (*args_local) [15];
  ConsoleLogger *this_local;
  
  if (this->loglevel < 1) {
    std::mutex::lock(&this->mtx);
    std::operator<<(this->out,"    ");
    print<char[15],int>(this,args,args_1);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}